

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::UnCapitalizedWords(string *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  pointer pcVar4;
  size_type sVar5;
  ulong uVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + s->_M_string_length);
  sVar5 = s->_M_string_length;
  if (sVar5 != 0) {
    uVar6 = 0;
    do {
      pcVar1 = (s->_M_dataplus)._M_p;
      cVar2 = pcVar1[uVar6];
      iVar3 = isalpha((int)cVar2);
      if (iVar3 != 0) {
        if (uVar6 == 0) {
          iVar3 = tolower((int)*pcVar1);
          cVar2 = (char)iVar3;
          pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        }
        else {
          iVar3 = isspace((int)pcVar1[uVar6 - 1]);
          if (iVar3 == 0) goto LAB_003edacd;
          iVar3 = tolower((int)cVar2);
          cVar2 = (char)iVar3;
          pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p + uVar6;
        }
        *pcVar4 = cVar2;
        sVar5 = s->_M_string_length;
      }
LAB_003edacd:
      uVar6 = uVar6 + 1;
    } while (uVar6 < sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::UnCapitalizedWords(const kwsys_stl::string& s)
{
  kwsys_stl::string n(s);
  for (size_t i = 0; i < s.size(); i++)
    {
#if defined(_MSC_VER) && defined (_MT) && defined (_DEBUG)
    // MS has an assert that will fail if s[i] < 0; setting
    // LC_CTYPE using setlocale() does *not* help. Painful.
    if ((int)s[i] >= 0 && isalpha(s[i]) &&
        (i == 0 || ((int)s[i - 1] >= 0 && isspace(s[i - 1]))))
#else
    if (isalpha(s[i]) && (i == 0 || isspace(s[i - 1])))
#endif
      {
      n[i] = static_cast<kwsys_stl::string::value_type>(tolower(s[i]));
      }
    }
  return n;
}